

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

void Imf_3_3::(anonymous_namespace)::
     readStringList<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
               (char **readPtr,char *endPtr,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *outputVector,int numberOfStrings)

{
  long lVar1;
  undefined8 uVar2;
  uint64_t uVar3;
  reference pvVar4;
  int in_ECX;
  InputExc *in_RDX;
  ulong in_RSI;
  long *in_RDI;
  int i_1;
  int i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> lengths;
  iterator in_stack_ffffffffffffff18;
  InputExc *in_stack_ffffffffffffff20;
  value_type *__x;
  allocator_type *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  const_iterator __position;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff40;
  undefined1 local_81 [33];
  _Base_ptr local_60;
  int local_54;
  int local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  int local_1c;
  InputExc *local_18;
  ulong local_10;
  long *local_8;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (in_ECX == 0) {
    if (in_RSI < *in_RDI + 4U) {
      uVar2 = __cxa_allocate_exception(0x48);
      Iex_3_3::InputExc::InputExc
                (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18._M_node);
      __cxa_throw(uVar2,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
    }
    Xdr::read<Imf_3_3::CharPtrIO,char_const*>
              ((char **)in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18._M_node);
  }
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xb9a4ff);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff30);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xb9a525);
  for (local_50 = 0; local_50 < local_1c; local_50 = local_50 + 1) {
    uVar3 = anon_unknown_3::readVariableLengthInteger
                      ((char **)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_48,(long)local_50);
    *pvVar4 = uVar3;
  }
  local_54 = 0;
  while( true ) {
    if (local_1c <= local_54) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff30)
      ;
      return;
    }
    lVar1 = *local_8;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_48,(long)local_54);
    if (local_10 < lVar1 + *pvVar4) break;
    in_stack_ffffffffffffff20 = local_18;
    local_60 = (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(in_stack_ffffffffffffff18._M_node);
    __x = (value_type *)*local_8;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_48,(long)local_54);
    in_stack_ffffffffffffff30 = (allocator_type *)*pvVar4;
    __position._M_node = (_Base_ptr)local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_81 + 1),(char *)__x,(ulong)in_stack_ffffffffffffff30,
               (allocator *)__position._M_node);
    in_stack_ffffffffffffff18 =
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff30,__position,__x);
    std::__cxx11::string::~string((string *)(local_81 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_81);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_48,(long)local_54);
    *local_8 = *pvVar4 + *local_8;
    local_54 = local_54 + 1;
  }
  uVar2 = __cxa_allocate_exception(0x48);
  Iex_3_3::InputExc::InputExc(in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18._M_node);
  __cxa_throw(uVar2,&Iex_3_3::InputExc::typeinfo,Iex_3_3::InputExc::~InputExc);
}

Assistant:

void
readStringList (
    const char*& readPtr,
    const char*  endPtr,
    T&           outputVector,
    int          numberOfStrings = 0)
{
    if (numberOfStrings == 0)
    {
        if (readPtr + 4 > endPtr)
        {
            throw IEX_NAMESPACE::InputExc (
                "IDManifest too small for string list size");
        }
        Xdr::read<CharPtrIO> (readPtr, numberOfStrings);
    }

    vector<size_t> lengths (numberOfStrings);

    for (int i = 0; i < numberOfStrings; ++i)
    {
        lengths[i] = readVariableLengthInteger (readPtr, endPtr);
    }
    for (int i = 0; i < numberOfStrings; ++i)
    {

        if (readPtr + lengths[i] > endPtr)
        {
            throw IEX_NAMESPACE::InputExc ("IDManifest too small for string");
        }
        outputVector.insert (outputVector.end (), string (readPtr, lengths[i]));
        readPtr += lengths[i];
    }
}